

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseEndOfLine(Lexer *this)

{
  pointer pSVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = this->m_current;
  cVar2 = *pcVar3;
  if (cVar2 == '\r') {
    AdvanceCurrent(this);
    pcVar3 = this->m_current;
    cVar2 = *pcVar3;
  }
  if ((cVar2 != '\0') && (pcVar3 <= this->m_end)) {
    if (cVar2 == '\n') {
      AdvanceCurrent(this);
    }
    pSVar1 = (this->m_symbolList).
             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((this->m_symbolList).
         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
         super__Vector_impl_data._M_start != pSVar1) && (pSVar1[-1].type != NewLine)) {
      CreateSymbol(this,NewLine);
    }
    this->m_lineNumber = this->m_lineNumber + 1;
    this->m_columnNumber = 1;
    this->m_columnMarker = 1;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseEndOfLine()
	{
		// Handle both Unix and Windows style line ends.
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
		// No need to add redundant end of line symbols
		if (!m_symbolList.empty() && m_symbolList.back().type != SymbolType::NewLine)
			CreateSymbol(SymbolType::NewLine);
		++m_lineNumber;
		m_columnNumber = 1;
		m_columnMarker = 1;
	}